

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakeDirectoryCommand.cxx
# Opt level: O2

bool __thiscall
cmMakeDirectoryCommand::InitialPass
          (cmMakeDirectoryCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  pointer pbVar1;
  bool bVar2;
  string e;
  string local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((long)(args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 == 0x20) {
    bVar2 = cmMakefile::CanIWriteThisFile
                      ((this->super_cmCommand).Makefile,(pbVar1->_M_dataplus)._M_p);
    if (bVar2) {
      cmsys::SystemTools::MakeDirectory
                ((((args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p);
      return true;
    }
    std::operator+(&local_30,"attempted to create a directory: ",
                   (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start);
    std::operator+(&local_50,&local_30," into a source directory.");
    std::__cxx11::string::~string((string *)&local_30);
    cmCommand::SetError(&this->super_cmCommand,&local_50);
    cmSystemTools::s_FatalErrorOccured = true;
  }
  else {
    std::__cxx11::string::string
              ((string *)&local_50,"called with incorrect number of arguments",
               (allocator *)&local_30);
    cmCommand::SetError(&this->super_cmCommand,&local_50);
  }
  std::__cxx11::string::~string((string *)&local_50);
  return false;
}

Assistant:

bool cmMakeDirectoryCommand::InitialPass(std::vector<std::string> const& args,
                                         cmExecutionStatus&)
{
  if (args.size() != 1) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }
  if (!this->Makefile->CanIWriteThisFile(args[0].c_str())) {
    std::string e = "attempted to create a directory: " + args[0] +
      " into a source directory.";
    this->SetError(e);
    cmSystemTools::SetFatalErrorOccured();
    return false;
  }
  cmSystemTools::MakeDirectory(args[0].c_str());
  return true;
}